

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

uint8_t * __thiscall
proto2_unittest::TestNestedMessageHasBits_NestedMessage::_InternalSerialize
          (TestNestedMessageHasBits_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  uint8_t *target_00;
  RepeatedField<int> *this_00;
  const_reference piVar4;
  RepeatedPtrField<proto2_unittest::ForeignMessage> *this_01;
  const_reference this_02;
  UnknownFieldSet *unknown_fields;
  ForeignMessage *repfield;
  uint local_38;
  uint n_1;
  uint i_1;
  int n;
  int i;
  uint32_t cached_has_bits;
  TestNestedMessageHasBits_NestedMessage *this_;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  TestNestedMessageHasBits_NestedMessage *this_local;
  
  i_1 = 0;
  iVar2 = _internal_nestedmessage_repeated_int32_size(this);
  stream_local = (EpsCopyOutputStream *)target;
  for (; (int)i_1 < iVar2; i_1 = i_1 + 1) {
    target_00 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace
                          (stream,(uint8_t *)stream_local);
    this_00 = _internal_nestedmessage_repeated_int32(this);
    piVar4 = google::protobuf::RepeatedField<int>::Get(this_00,i_1);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::WriteInt32ToArray
                             (1,*piVar4,target_00);
  }
  local_38 = 0;
  uVar3 = _internal_nestedmessage_repeated_foreignmessage_size(this);
  for (; local_38 < uVar3; local_38 = local_38 + 1) {
    this_01 = _internal_nestedmessage_repeated_foreignmessage(this);
    this_02 = google::protobuf::RepeatedPtrField<proto2_unittest::ForeignMessage>::Get
                        (this_01,local_38);
    iVar2 = proto2_unittest::ForeignMessage::GetCachedSize(this_02);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormatLite::InternalWriteMessage
                             (2,(MessageLite *)this_02,iVar2,(uint8_t *)stream_local,stream);
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_Message).super_MessageLite._internal_metadata_);
  if (bVar1) {
    unknown_fields =
         google::protobuf::internal::InternalMetadata::
         unknown_fields<google::protobuf::UnknownFieldSet>
                   (&(this->super_Message).super_MessageLite._internal_metadata_,
                    google::protobuf::UnknownFieldSet::default_instance);
    stream_local = (EpsCopyOutputStream *)
                   google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                             (unknown_fields,(uint8_t *)stream_local,stream);
  }
  return (uint8_t *)stream_local;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageHasBits_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:proto2_unittest.TestNestedMessageHasBits.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 nestedmessage_repeated_int32 = 1;
  for (int i = 0, n = this_._internal_nestedmessage_repeated_int32_size(); i < n; ++i) {
    target = stream->EnsureSpace(target);
    target = ::_pbi::WireFormatLite::WriteInt32ToArray(
        1, this_._internal_nestedmessage_repeated_int32().Get(i), target);
  }

  // repeated .proto2_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nestedmessage_repeated_foreignmessage_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nestedmessage_repeated_foreignmessage().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:proto2_unittest.TestNestedMessageHasBits.NestedMessage)
  return target;
}